

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O0

vector<JFSON::Json,_std::allocator<JFSON::Json>_> *
JFSON::Json::parse_multi
          (vector<JFSON::Json,_std::allocator<JFSON::Json>_> *__return_storage_ptr__,string *in,
          size_type *parser_stop_pos,string *err,JsonParse strategy)

{
  string *psVar1;
  string *psVar2;
  byte local_89;
  undefined1 local_68 [24];
  undefined1 local_50 [8];
  JsonParser parser;
  JsonParse strategy_local;
  string *err_local;
  size_type *parser_stop_pos_local;
  string *in_local;
  vector<JFSON::Json,_std::allocator<JFSON::Json>_> *json_vec;
  
  parser.str = (string *)0x0;
  parser.err._0_1_ = 0;
  *parser_stop_pos = 0;
  local_68[0x17] = 0;
  local_50 = (undefined1  [8])in;
  parser.i = (size_t)err;
  parser.err._4_4_ = strategy;
  parser.strategy = strategy;
  std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>::vector(__return_storage_ptr__);
  while( true ) {
    psVar1 = parser.str;
    psVar2 = (string *)std::__cxx11::string::size();
    local_89 = 0;
    if (psVar1 != psVar2) {
      local_89 = (byte)parser.err ^ 0xff;
    }
    if ((local_89 & 1) == 0) {
      return __return_storage_ptr__;
    }
    anon_unknown_21::JsonParser::parse_json((JsonParser *)local_68,(int)local_50);
    std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>::push_back
              (__return_storage_ptr__,(value_type *)local_68);
    ~Json((Json *)local_68);
    if (((byte)parser.err & 1) != 0) {
      return __return_storage_ptr__;
    }
    anon_unknown_21::JsonParser::consume_garbage((JsonParser *)local_50);
    if (((byte)parser.err & 1) != 0) break;
    *parser_stop_pos = (size_type)parser.str;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Json> Json::parse_multi(const string &in,
                               std::string::size_type &parser_stop_pos,
                               string &err,
                               JsonParse strategy) {
    JsonParser parser { in, 0, err, false, strategy };
    parser_stop_pos = 0;
    vector<Json> json_vec;
    while (parser.i != in.size() && !parser.failed) {
        json_vec.push_back(parser.parse_json(0));
        if (parser.failed)
            break;

        // Check for another object
        parser.consume_garbage();
        if (parser.failed)
            break;
        parser_stop_pos = parser.i;
    }
    return json_vec;
}